

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObject::killTimer(QObject *this,TimerId id)

{
  QObjectData *pQVar1;
  QThread *pQVar2;
  TimerId TVar3;
  int iVar4;
  QThread *pQVar5;
  qsizetype qVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ushort *puVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QMessageLogger local_50;
  TimerId id_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  pQVar2 = (QThread *)pQVar1[1].q_ptr[5]._vptr_QObject;
  id_local = id;
  pQVar5 = QThread::currentThread();
  if (pQVar5 == pQVar2) {
    if (0 < (int)id_local) {
      if (pQVar1[1]._vptr_QObjectData != (_func_int **)0x0) {
        qVar6 = QtPrivate::indexOf<Qt::TimerId,Qt::TimerId>
                          ((QList<Qt::TimerId> *)(pQVar1[1]._vptr_QObjectData + 6),&id_local,0);
        if ((int)qVar6 != -1) {
          if (pQVar1[1].q_ptr[6]._vptr_QObject != (_func_int **)0x0) {
            QAbstractEventDispatcher::unregisterTimer
                      ((QAbstractEventDispatcher *)pQVar1[1].q_ptr[6]._vptr_QObject,id_local);
          }
          QList<Qt::TimerId>::remove
                    ((QList<Qt::TimerId> *)(pQVar1[1]._vptr_QObjectData + 6),
                     (char *)(long)(int)qVar6);
          QAbstractEventDispatcherPrivate::releaseTimerId(id_local);
          goto LAB_0028a40d;
        }
      }
      TVar3 = id_local;
      local_50.context.version = 2;
      local_50.context.function._4_4_ = 0;
      local_50.context._4_8_ = 0;
      local_50.context._12_8_ = 0;
      local_50.context.category = "default";
      iVar4 = (**this->_vptr_QObject)(this);
      pcVar7 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar4));
      objectName((QString *)&QStack_68,this);
      puVar8 = QString::utf16((QString *)&QStack_68);
      QMessageLogger::warning
                (&local_50,
                 "QObject::killTimer(): Error: timer id %d is not valid for object %p (%s, %ls), timer has not been killed"
                 ,(ulong)TVar3,this,pcVar7,puVar8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    }
  }
  else {
    local_50.context.version = 2;
    local_50.context.function._4_4_ = 0;
    local_50.context._4_8_ = 0;
    local_50.context._12_8_ = 0;
    local_50.context.category = "default";
    QMessageLogger::warning
              (&local_50,"QObject::killTimer: Timers cannot be stopped from another thread");
  }
LAB_0028a40d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObject::killTimer(Qt::TimerId id)
{
    Q_D(QObject);
    if (Q_UNLIKELY(thread() != QThread::currentThread())) {
        qWarning("QObject::killTimer: Timers cannot be stopped from another thread");
        return;
    }
    if (id > Qt::TimerId::Invalid) {
        int at = d->extraData ? d->extraData->runningTimers.indexOf(id) : -1;
        if (at == -1) {
            // timer isn't owned by this object
            qWarning("QObject::killTimer(): Error: timer id %d is not valid for object %p (%s, %ls), timer has not been killed",
                     qToUnderlying(id),
                     this,
                     metaObject()->className(),
                     qUtf16Printable(objectName()));
            return;
        }

        auto thisThreadData = d->threadData.loadRelaxed();
        if (thisThreadData->hasEventDispatcher())
            thisThreadData->eventDispatcher.loadRelaxed()->unregisterTimer(id);

        d->extraData->runningTimers.remove(at);
        QAbstractEventDispatcherPrivate::releaseTimerId(id);
    }
}